

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_both.cc
# Opt level: O0

bool bssl::tls13_add_finished(SSL_HANDSHAKE *hs)

{
  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *this;
  SSL *ssl_00;
  _func_bool_SSL_ptr_CBB_ptr_CBB_ptr_uint8_t *p_Var1;
  bool bVar2;
  int iVar3;
  cbb_st *pcVar4;
  undefined1 local_c8 [8];
  CBB body;
  ScopedCBB cbb;
  uint8_t verify_data [64];
  size_t verify_data_len;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  bVar2 = tls13_finished_mac(hs,(uint8_t *)((long)&cbb.ctx_.u + 0x18),(size_t *)(verify_data + 0x38)
                             ,(bool)(ssl_00->field_0xa4 & 1));
  if (!bVar2) {
    ssl_send_alert(ssl_00,2,0x50);
    ERR_put_error(0x10,0,0x8e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                  ,0x277);
    return false;
  }
  this = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(this);
  p_Var1 = ssl_00->method->init_message;
  pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(this);
  bVar2 = (*p_Var1)(ssl_00,pcVar4,(CBB *)local_c8,'\x14');
  if ((bVar2) &&
     (iVar3 = CBB_add_bytes((CBB *)local_c8,(uint8_t *)((long)&cbb.ctx_.u + 0x18),verify_data._56_8_
                           ), iVar3 != 0)) {
    pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&body.u + 0x18));
    bVar2 = ssl_add_message_cbb(ssl_00,pcVar4);
    if (bVar2) {
      hs_local._7_1_ = true;
      goto LAB_001c3a9e;
    }
  }
  hs_local._7_1_ = false;
LAB_001c3a9e:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18));
  return hs_local._7_1_;
}

Assistant:

bool tls13_add_finished(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  size_t verify_data_len;
  uint8_t verify_data[EVP_MAX_MD_SIZE];

  if (!tls13_finished_mac(hs, verify_data, &verify_data_len, ssl->server)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
    OPENSSL_PUT_ERROR(SSL, SSL_R_DIGEST_CHECK_FAILED);
    return false;
  }

  ScopedCBB cbb;
  CBB body;
  if (!ssl->method->init_message(ssl, cbb.get(), &body, SSL3_MT_FINISHED) ||
      !CBB_add_bytes(&body, verify_data, verify_data_len) ||
      !ssl_add_message_cbb(ssl, cbb.get())) {
    return false;
  }

  return true;
}